

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O3

void __thiscall
amrex::MLMG::getFluxes
          (MLMG *this,
          Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
          *a_flux,Location a_loc)

{
  MLLinOp *pMVar1;
  pointer pAVar2;
  Any *s;
  pointer this_00;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> solmf;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> local_58;
  MultiFab *local_38;
  
  pMVar1 = this->linop;
  if (((pMVar1->m_ixtype).vect[1] != 0 || (pMVar1->m_ixtype).vect[0] != 0) ||
     ((pMVar1->m_ixtype).vect[2] != 0)) {
    Abort_host("Calling wrong getFluxes for nodal solver");
  }
  local_58.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (MultiFab **)0x0;
  local_58.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (MultiFab **)0x0;
  this_00 = (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
            super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
            super__Vector_impl_data._M_start;
  pAVar2 = (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (this_00 != pAVar2) {
    do {
      local_38 = Any::get<amrex::MultiFab>(this_00);
      if (local_58.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_58.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
        _M_realloc_insert<amrex::MultiFab*>
                  ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)&local_58,
                   (iterator)
                   local_58.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                   super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl
                   .super__Vector_impl_data._M_finish,&local_38);
      }
      else {
        *local_58.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
         super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
         super__Vector_impl_data._M_finish = local_38;
        local_58.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_58.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
             super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      this_00 = this_00 + 1;
    } while (this_00 != pAVar2);
  }
  getFluxes(this,a_flux,&local_58,a_loc);
  if (local_58.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
MLMG::getFluxes (const Vector<Array<MultiFab*,AMREX_SPACEDIM> >& a_flux,
                 Location a_loc)
{
    if (!linop.isCellCentered()) {
       amrex::Abort("Calling wrong getFluxes for nodal solver");
    }

    AMREX_ASSERT(sol.size() == a_flux.size());
    Vector<MultiFab*> solmf;
    for (auto & s : sol) {
        solmf.push_back(&(s.get<MultiFab>()));
    }
    getFluxes(a_flux, solmf, a_loc);
}